

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O3

unsigned_long_long strpool_inject(strpool_t *pool,char *string,int length)

{
  char cVar1;
  uint uVar2;
  strpool_internal_block_t *psVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  strpool_internal_hash_slot_t *psVar7;
  strpool_internal_entry_t *psVar8;
  strpool_internal_handle_t *psVar9;
  int iVar10;
  uint uVar11;
  char cVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  long lVar17;
  int iVar18;
  uint uVar19;
  strpool_internal_hash_slot_t *psVar20;
  uint uVar21;
  ulong uVar22;
  ulong __n;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  char *data;
  uint *puVar26;
  int local_60;
  ulong uVar16;
  
  if (length < 0 || string == (char *)0x0) {
    return 0;
  }
  __n = (ulong)(uint)length;
  if (0 < (long)pool->block_count) {
    lVar14 = 0;
    do {
      lVar17 = *(long *)((long)&pool->blocks->data + lVar14);
      if (((char *)(lVar17 + 8U) <= string) &&
         (string < (char *)(lVar17 + *(int *)((long)&pool->blocks->capacity + lVar14)))) {
        if ((*(int *)(string + -4) == length) &&
           ((string[__n] == '\0' && (uVar19 = *(uint *)(string + -8), uVar19 != 0))))
        goto LAB_00104979;
        break;
      }
      lVar14 = lVar14 + 0x20;
    } while ((long)pool->block_count * 0x20 != lVar14);
  }
  if (pool->ignore_case == 0) {
    if (0 < length) {
      uVar6 = 0;
      uVar19 = 0x1505;
      do {
        uVar19 = uVar19 * 0x21 ^ (int)string[uVar6];
        uVar6 = uVar6 + 1;
      } while (__n != uVar6);
      goto LAB_00104973;
    }
  }
  else if (0 < length) {
    uVar19 = 0x1505;
    uVar6 = 0;
    do {
      cVar1 = string[uVar6];
      cVar12 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar12 = cVar1;
      }
      uVar19 = (int)cVar12 ^ uVar19 * 0x21;
      uVar6 = uVar6 + 1;
    } while (__n != uVar6);
    goto LAB_00104973;
  }
  uVar19 = 0x1505;
LAB_00104973:
  uVar19 = uVar19 + (uVar19 == 0);
LAB_00104979:
  uVar11 = pool->hash_capacity;
  uVar25 = uVar11 - 1;
  uVar21 = uVar25 & uVar19;
  psVar20 = pool->hash_table;
  iVar18 = psVar20[(int)uVar21].base_count;
  uVar24 = uVar21;
  uVar13 = uVar21;
  while (0 < iVar18) {
    uVar2 = psVar20[(int)uVar24].hash_key;
    if ((uVar2 == 0) && (psVar20[(int)uVar13].hash_key != 0)) {
      uVar13 = uVar24;
    }
    if (((uVar2 & uVar25) == uVar21) && (iVar18 = iVar18 + -1, uVar2 == uVar19)) {
      iVar10 = psVar20[(int)uVar24].entry_index;
      psVar8 = pool->entries;
      if (psVar8[iVar10].length == length) {
        if (pool->ignore_case == 0) {
          iVar5 = bcmp(psVar8[iVar10].data + 8,string,__n);
        }
        else {
          iVar5 = strncasecmp(psVar8[iVar10].data + 8,string,__n);
        }
        if (iVar5 == 0) {
          local_60 = psVar8[iVar10].handle_index;
          psVar9 = pool->handles + local_60;
          goto LAB_00104f31;
        }
      }
    }
    uVar24 = uVar24 + 1 & uVar25;
  }
  iVar10 = (int)((ulong)((long)(int)uVar11 * 0x55555555) >> 0x20) - uVar11;
  if ((int)(((iVar10 >> 1) - (iVar10 >> 0x1f)) + uVar11) <= pool->entry_count) {
    pool->hash_capacity = uVar11 * 2;
    psVar7 = (strpool_internal_hash_slot_t *)
             (**pool->memctx)(0,(long)(int)uVar11 * 0x18,0,0,0,0,
                              *(undefined8 *)((long)pool->memctx + 8));
    pool->hash_table = psVar7;
    if (psVar7 == (strpool_internal_hash_slot_t *)0x0) {
      __assert_fail("pool->hash_table",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x33c,"void strpool_internal_expand_hash_table(strpool_t *)");
    }
    memset(psVar7,0,(long)pool->hash_capacity * 0xc);
    if (0 < (int)uVar11) {
      uVar6 = 0;
      do {
        uVar24 = psVar20[uVar6].hash_key;
        if ((long)(int)uVar24 != 0) {
          uVar22 = (long)pool->hash_capacity - 1;
          uVar15 = uVar22 & (long)(int)uVar24;
          psVar7 = pool->hash_table;
          uVar13 = psVar7[uVar15].hash_key;
          uVar23 = uVar15;
          uVar16 = uVar15;
          while (uVar13 != 0) {
            uVar13 = (int)uVar16 + 1U & (uint)uVar22;
            uVar16 = (ulong)uVar13;
            uVar23 = (ulong)(int)uVar13;
            uVar13 = psVar7[uVar23].hash_key;
          }
          psVar7[uVar23].hash_key = uVar24;
          iVar10 = psVar20[uVar6].entry_index;
          psVar7[uVar23].entry_index = iVar10;
          pool->entries[iVar10].hash_slot = (int)uVar16;
          psVar7[uVar15].base_count = psVar7[uVar15].base_count + 1;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != uVar11);
    }
    (**pool->memctx)(psVar20,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
    uVar11 = pool->hash_capacity;
    uVar25 = uVar11 - 1;
    uVar21 = uVar25 & uVar19;
    psVar20 = pool->hash_table;
    uVar24 = uVar21;
    uVar13 = uVar21;
    for (; iVar18 != 0; iVar18 = iVar18 - (uint)((psVar20[lVar14].hash_key & uVar25) == uVar21)) {
      lVar14 = (long)(int)uVar24;
      if ((psVar20[lVar14].hash_key == 0) && (psVar20[(int)uVar13].hash_key != 0)) {
        uVar13 = uVar24;
      }
      uVar24 = uVar24 + 1 & uVar25;
    }
  }
  lVar14 = (long)(int)uVar13;
  if (psVar20[lVar14].hash_key != 0) {
    do {
      uVar13 = uVar13 + 1 & uVar11 - 1;
      lVar14 = (long)(int)uVar13;
    } while (psVar20[lVar14].hash_key != 0);
  }
  iVar18 = pool->entry_capacity;
  if (iVar18 <= pool->entry_count) {
    pool->entry_capacity = iVar18 * 2;
    psVar8 = (strpool_internal_entry_t *)
             (**pool->memctx)(0,(long)iVar18 << 6,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
    if (psVar8 == (strpool_internal_entry_t *)0x0) {
      __assert_fail("new_entries",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x359,"void strpool_internal_expand_entries(strpool_t *)");
    }
    memcpy(psVar8,pool->entries,(long)pool->entry_count << 5);
    (**pool->memctx)(pool->entries,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
    pool->entries = psVar8;
    psVar20 = pool->hash_table;
  }
  if ((psVar20[lVar14].hash_key != 0) || ((pool->hash_capacity - 1U & uVar19) != uVar21)) {
    __assert_fail("!pool->hash_table[ slot ].hash_key && ( hash & ( (unsigned int) pool->hash_capacity - 1 ) ) == (unsigned int) base_slot"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x3e9,"unsigned long long strpool_inject(strpool_t *, const char *, int)");
  }
  psVar20[lVar14].hash_key = uVar19;
  iVar18 = pool->entry_count;
  psVar20[lVar14].entry_index = iVar18;
  psVar20[(int)uVar21].base_count = psVar20[(int)uVar21].base_count + 1;
  local_60 = pool->handle_count;
  iVar10 = pool->handle_capacity;
  if (local_60 < iVar10) {
    lVar14 = (long)local_60;
    psVar9 = pool->handles;
    psVar9[lVar14].counter = 1;
    pool->handle_count = local_60 + 1;
  }
  else {
    local_60 = pool->handle_freelist_head;
    lVar14 = (long)local_60;
    if (lVar14 < 0) {
      pool->handle_capacity = iVar10 * 2;
      psVar9 = (strpool_internal_handle_t *)
               (**pool->memctx)(0,(long)iVar10 << 4,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8))
      ;
      if (psVar9 == (strpool_internal_handle_t *)0x0) {
        __assert_fail("new_handles",
                      "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                      ,0x365,"void strpool_internal_expand_handles(strpool_t *)");
      }
      memcpy(psVar9,pool->handles,(long)pool->handle_count << 3);
      (**pool->memctx)(pool->handles,0,0,0,0,0,*(undefined8 *)((long)pool->memctx + 8));
      pool->handles = psVar9;
      local_60 = pool->handle_count;
      lVar14 = (long)local_60;
      psVar9[lVar14].counter = 1;
      pool->handle_count = local_60 + 1;
      iVar18 = pool->entry_count;
    }
    else {
      psVar9 = pool->handles;
      iVar10 = psVar9[lVar14].entry_index;
      if (pool->handle_freelist_tail == local_60) {
        pool->handle_freelist_tail = iVar10;
      }
      pool->handle_freelist_head = iVar10;
    }
  }
  psVar9[lVar14].entry_index = iVar18;
  psVar8 = pool->entries + iVar18;
  pool->entry_count = iVar18 + 1;
  iVar18 = length + 9;
  if (length + 9 < pool->min_data_size) {
    iVar18 = pool->min_data_size;
  }
  uVar11 = iVar18 - 1U >> 1 | iVar18 - 1U;
  uVar11 = uVar11 >> 2 | uVar11;
  uVar11 = uVar11 >> 4 | uVar11;
  uVar11 = uVar11 >> 8 | uVar11;
  uVar11 = uVar11 >> 0x10 | uVar11;
  iVar18 = uVar11 + 1 + (uint)(uVar11 == 0xffffffff);
  psVar3 = pool->blocks;
  if (0 < (long)pool->block_count) {
    lVar17 = 0;
    do {
      uVar6 = (ulong)psVar3[lVar17].free_list;
      if (-1 < (long)uVar6) {
        pcVar4 = psVar3[lVar17].data;
        iVar10 = *(int *)(pcVar4 + uVar6);
        if (iVar10 / 2 < iVar18) {
          if (iVar18 <= iVar10) {
            puVar26 = (uint *)(pcVar4 + uVar6);
            psVar3[lVar17].free_list = *(int *)(pcVar4 + uVar6 + 4);
            iVar18 = iVar10;
            goto LAB_00104ed7;
          }
        }
        else {
          do {
            uVar23 = uVar6 & 0xffffffff;
            uVar6 = (ulong)*(int *)(pcVar4 + uVar6 + 4);
            if ((long)uVar6 < 0) goto LAB_00104e6a;
            iVar10 = *(int *)(pcVar4 + uVar6);
          } while (iVar18 <= iVar10 / 2);
          if (iVar18 <= iVar10) {
            puVar26 = (uint *)(pcVar4 + uVar6);
            *(undefined4 *)(pcVar4 + uVar23 + 4) = *(undefined4 *)(pcVar4 + uVar6 + 4);
            iVar18 = iVar10;
            goto LAB_00104ed7;
          }
        }
      }
LAB_00104e6a:
      lVar17 = lVar17 + 1;
    } while (lVar17 != pool->block_count);
  }
  iVar10 = pool->current_block;
  puVar26 = (uint *)psVar3[iVar10].tail;
  if ((*(int *)&psVar3[iVar10].data - (int)puVar26) + psVar3[iVar10].capacity < iVar18) {
    iVar10 = pool->block_size;
    if (pool->block_size < iVar18) {
      iVar10 = iVar18;
    }
    iVar10 = strpool_internal_add_block(pool,iVar10);
    pool->current_block = iVar10;
    puVar26 = (uint *)pool->blocks[iVar10].tail;
    pool->blocks[iVar10].tail = (char *)((long)iVar18 + (long)puVar26);
  }
  else {
    psVar3[iVar10].tail = (char *)((long)iVar18 + (long)puVar26);
  }
LAB_00104ed7:
  psVar8->hash_slot = uVar13;
  psVar8->handle_index = local_60;
  psVar8->data = (char *)puVar26;
  psVar8->size = iVar18;
  psVar8->length = length;
  psVar8->refcount = 0;
  *puVar26 = uVar19;
  puVar26[1] = length;
  memcpy(puVar26 + 2,string,__n);
  *(undefined1 *)((long)puVar26 + __n + 8) = 0;
  psVar9 = pool->handles + lVar14;
LAB_00104f31:
  return (long)(local_60 + 1) & pool->index_mask |
         ((long)psVar9->counter & pool->counter_mask) << ((byte)pool->counter_shift & 0x3f);
}

Assistant:

STRPOOL_U64 strpool_inject( strpool_t* pool, char const* string, int length )
    {
    if( !string || length < 0 ) return 0;

    STRPOOL_U32 hash = strpool_internal_find_in_blocks( pool, string, length );
    // If no stored hash, calculate it from data
    if( !hash ) hash = strpool_internal_calculate_hash( string, length, pool->ignore_case ); 

    // Return handle to existing string, if it is already in pool
    int base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
    int base_count = pool->hash_table[ base_slot ].base_count;
    int slot = base_slot;
    int first_free = slot;
    while( base_count > 0 )
        {
        STRPOOL_U32 slot_hash = pool->hash_table[ slot ].hash_key;
        if( slot_hash == 0 && pool->hash_table[ first_free ].hash_key != 0 ) first_free = slot;
        int slot_base = (int)( slot_hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        if( slot_base == base_slot ) 
            {
            STRPOOL_ASSERT( base_count > 0 );
            --base_count;
            if( slot_hash == hash )
                {
                int index = pool->hash_table[ slot ].entry_index;
                strpool_internal_entry_t* entry = &pool->entries[ index ];
                if( entry->length == length && 
                    ( 
                       ( !pool->ignore_case &&   STRPOOL_MEMCMP( entry->data + 2 * sizeof( STRPOOL_U32 ), string, (size_t)length ) == 0 )
                    || (  pool->ignore_case && STRPOOL_STRNICMP( entry->data + 2 * sizeof( STRPOOL_U32 ), string, (size_t)length ) == 0 ) 
                    ) 
                  )
                    {
                    int handle_index = entry->handle_index;
                    return strpool_internal_make_handle( handle_index, pool->handles[ handle_index ].counter, 
                        pool->index_mask, pool->counter_shift, pool->counter_mask );
                    }
                }
            }
        slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );
        }   

    // This is a new string, so let's add it

    if( pool->entry_count >= ( pool->hash_capacity  - pool->hash_capacity / 3 ) )
        {
        strpool_internal_expand_hash_table( pool );

        base_slot = (int)( hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
        slot = base_slot;
        first_free = slot;
        while( base_count )
            {
            STRPOOL_U32 slot_hash = pool->hash_table[ slot ].hash_key;
            if( slot_hash == 0 && pool->hash_table[ first_free ].hash_key != 0 ) first_free = slot;
            int slot_base = (int)( slot_hash & (STRPOOL_U32)( pool->hash_capacity - 1 ) );
            if( slot_base == base_slot )  --base_count;
            slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );
            }       
        }
        
    slot = first_free;
    while( pool->hash_table[ slot ].hash_key )
        slot = ( slot + 1 ) & ( pool->hash_capacity - 1 );

    if( pool->entry_count >= pool->entry_capacity )
        strpool_internal_expand_entries( pool );

    STRPOOL_ASSERT( !pool->hash_table[ slot ].hash_key && ( hash & ( (STRPOOL_U32) pool->hash_capacity - 1 ) ) == (STRPOOL_U32) base_slot );
    STRPOOL_ASSERT( hash );
    pool->hash_table[ slot ].hash_key = hash;
    pool->hash_table[ slot ].entry_index = pool->entry_count;
    ++pool->hash_table[ base_slot ].base_count;

    int handle_index;

    if( pool->handle_count < pool->handle_capacity )
        {
        handle_index = pool->handle_count;
        pool->handles[ pool->handle_count ].counter = 1;
        ++pool->handle_count;           
        }
    else if( pool->handle_freelist_head >= 0 )
        {
        handle_index = pool->handle_freelist_head;
        if( pool->handle_freelist_tail == pool->handle_freelist_head ) 
            pool->handle_freelist_tail = pool->handles[ pool->handle_freelist_head ].entry_index;
        pool->handle_freelist_head = pool->handles[ pool->handle_freelist_head ].entry_index;                       
        }
    else
        {
        strpool_internal_expand_handles( pool );
        handle_index = pool->handle_count;
        pool->handles[ pool->handle_count ].counter = 1;
        ++pool->handle_count;           
        }

    pool->handles[ handle_index ].entry_index = pool->entry_count;
        
    strpool_internal_entry_t* entry = &pool->entries[ pool->entry_count ];
    ++pool->entry_count;
        
    int data_size = length + 1 + (int) ( 2 * sizeof( STRPOOL_U32 ) );
    char* data = strpool_internal_get_data_storage( pool, data_size, &data_size );
    entry->hash_slot = slot;
    entry->handle_index = handle_index;
    entry->data = data;
    entry->size = data_size;
    entry->length = length;
    entry->refcount = 0;

    *(STRPOOL_U32*)(data) = hash;
    data += sizeof( STRPOOL_U32 );
    *(STRPOOL_U32*)(data) = (STRPOOL_U32) length;
    data += sizeof( STRPOOL_U32 );
    STRPOOL_MEMCPY( data, string, (size_t) length ); 
    data[ length ] = 0; // Ensure trailing zero

    return strpool_internal_make_handle( handle_index, pool->handles[ handle_index ].counter, pool->index_mask, 
        pool->counter_shift, pool->counter_mask );
    }